

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>::
write_decimal<int>(basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
                   *this,int value)

{
  type pcVar1;
  char8_t *pcVar2;
  uint32_t in_ESI;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
  *in_RDI;
  type *it;
  int num_digits;
  bool is_negative;
  main_type abs_value;
  int in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  type local_28;
  type *local_20;
  int local_18;
  byte local_11;
  uint32_t local_10;
  
  local_10 = in_ESI;
  local_11 = internal::is_negative<int>(in_ESI);
  if ((bool)local_11) {
    local_10 = -local_10;
  }
  local_18 = internal::count_digits(local_10);
  pcVar1 = reserve(in_RDI,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  local_20 = &local_28;
  local_28 = pcVar1;
  if ((local_11 & 1) != 0) {
    local_28 = pcVar1 + 1;
    *pcVar1 = 0x2d;
  }
  pcVar2 = internal::format_decimal<fmt::v5::char8_t,fmt::v5::char8_t*,unsigned_int>
                     ((char8_t *)in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  *local_20 = pcVar2;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }